

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtThreads.cpp
# Opt level: O2

void cbtParallelFor(int iBegin,int iEnd,int grainSize,cbtIParallelForBody *body)

{
  (*gBtTaskScheduler->_vptr_cbtITaskScheduler[5])(gBtTaskScheduler,iBegin,iEnd,grainSize,body);
  return;
}

Assistant:

void cbtParallelFor(int iBegin, int iEnd, int grainSize, const cbtIParallelForBody& body)
{
#if BT_THREADSAFE

#if BT_DETECT_BAD_THREAD_INDEX
	if (!cbtThreadsAreRunning())
	{
		// clear out thread ids
		for (int i = 0; i < BT_MAX_THREAD_COUNT; ++i)
		{
			gDebugThreadIds[i] = kInvalidThreadId;
		}
	}
#endif  // #if BT_DETECT_BAD_THREAD_INDEX

	cbtAssert(gBtTaskScheduler != NULL);  // call cbtSetTaskScheduler() with a valid task scheduler first!
	gBtTaskScheduler->parallelFor(iBegin, iEnd, grainSize, body);

#else  // #if BT_THREADSAFE

	// non-parallel version of cbtParallelFor
	cbtAssert(!"called cbtParallelFor in non-threadsafe build. enable BT_THREADSAFE");
	body.forLoop(iBegin, iEnd);

#endif  // #if BT_THREADSAFE
}